

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  bool bVar1;
  pointer pbVar2;
  string filename;
  string srcFiles;
  string local_90;
  value_type local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pbVar2 = (srcs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar2 == (srcs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      if (local_70._M_string_length != 0) {
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&local_90,this->Makefile);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&((this->Internal).Pointer)->SourceEntries,&local_70);
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                  (&((this->Internal).Pointer)->SourceBacktraces,(value_type *)&local_90);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_90);
      }
      break;
    }
    std::__cxx11::string::string((string *)&local_90,(string *)pbVar2);
    if ((*local_90._M_dataplus._M_p == '$') && (local_90._M_dataplus._M_p[1] == '<')) {
LAB_003ea2f9:
      std::__cxx11::string::append((char *)&local_70);
      bVar1 = true;
      std::__cxx11::string::append((string *)&local_70);
    }
    else {
      if (local_90._M_string_length == 0) {
LAB_003ea2e4:
        cmMakefile::GetOrCreateSource(this->Makefile,&local_90,false);
        goto LAB_003ea2f9;
      }
      ProcessSourceItemCMP0049(&local_50,this,&local_90);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (local_90._M_string_length != 0) goto LAB_003ea2e4;
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_90);
    pbVar2 = pbVar2 + 1;
  } while (bVar1);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for (std::vector<std::string>::const_iterator i = srcs.begin();
       i != srcs.end(); ++i) {
    std::string filename = *i;
    const char* src = filename.c_str();

    if (!(src[0] == '$' && src[1] == '<')) {
      if (!filename.empty()) {
        filename = this->ProcessSourceItemCMP0049(filename);
        if (filename.empty()) {
          return;
        }
      }
      this->Makefile->GetOrCreateSource(filename);
    }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
  }
  if (!srcFiles.empty()) {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(srcFiles);
    this->Internal->SourceBacktraces.push_back(lfbt);
  }
}